

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int quantize_segment_mix(mixed_segment *segment)

{
  undefined8 *puVar1;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint32_t samples;
  float *out;
  float *in;
  uint32_t local_34;
  float local_30;
  float local_2c;
  float *local_28;
  float *local_20;
  
  puVar1 = (undefined8 *)segment->data;
  local_2c = *(float *)(puVar1 + 2);
  local_30 = *(float *)((long)puVar1 + 0x14);
  local_34 = 0xffffffff;
  buffer = (mixed_buffer *)*puVar1;
  buffer_00 = (mixed_buffer *)puVar1[1];
  mixed_buffer_request_read(&local_20,&local_34,buffer);
  if (buffer == buffer_00) {
    if ((ulong)local_34 != 0) {
      uVar2 = 0;
      do {
        auVar3 = ZEXT416((uint)(local_2c * local_20[uVar2]));
        auVar3 = vroundss_avx(auVar3,auVar3,9);
        local_20[uVar2] = local_20[uVar2] * (1.0 - local_30) + local_30 * (auVar3._0_4_ / local_2c);
        uVar2 = uVar2 + 1;
      } while (local_34 != uVar2);
    }
  }
  else {
    mixed_buffer_request_write(&local_28,&local_34,buffer_00);
    if ((ulong)local_34 != 0) {
      uVar2 = 0;
      do {
        auVar3 = ZEXT416((uint)(local_2c * local_20[uVar2]));
        auVar3 = vroundss_avx(auVar3,auVar3,9);
        local_28[uVar2] = local_20[uVar2] * (1.0 - local_30) + local_30 * (auVar3._0_4_ / local_2c);
        uVar2 = uVar2 + 1;
      } while (local_34 != uVar2);
    }
    mixed_buffer_finish_read(local_34,buffer);
    mixed_buffer_finish_write(local_34,buffer_00);
  }
  return 1;
}

Assistant:

VECTORIZE int quantize_segment_mix(struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;

  float steps = data->steps;
  float mix = data->mix;
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float s = in[i];
      float o = floor(s * steps) / steps;
      out[i] = LERP(s, o, mix);
    });
  return 1;
}